

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcapimin.c
# Opt level: O0

void jpeg_write_marker(j_compress_ptr cinfo,int marker,JOCTET *dataptr,uint datalen)

{
  code *pcVar1;
  int in_ECX;
  undefined1 *in_RDX;
  undefined4 in_ESI;
  long *in_RDI;
  _func_void_j_compress_ptr_int *write_marker_byte;
  int local_1c;
  undefined1 *local_18;
  
  if ((*(int *)((long)in_RDI + 0x154) != 0) ||
     (((*(int *)((long)in_RDI + 0x24) != 0x65 && (*(int *)((long)in_RDI + 0x24) != 0x66)) &&
      (*(int *)((long)in_RDI + 0x24) != 0x67)))) {
    *(undefined4 *)(*in_RDI + 0x28) = 0x15;
    *(undefined4 *)(*in_RDI + 0x2c) = *(undefined4 *)((long)in_RDI + 0x24);
    (**(code **)*in_RDI)(in_RDI);
  }
  (**(code **)(in_RDI[0x42] + 0x28))(in_RDI,in_ESI,in_ECX);
  pcVar1 = *(code **)(in_RDI[0x42] + 0x30);
  local_1c = in_ECX;
  local_18 = in_RDX;
  while (local_1c != 0) {
    (*pcVar1)(in_RDI,*local_18);
    local_18 = local_18 + 1;
    local_1c = local_1c + -1;
  }
  return;
}

Assistant:

GLOBAL(void)
jpeg_write_marker (j_compress_ptr cinfo, int marker,
		   const JOCTET *dataptr, unsigned int datalen)
{
  JMETHOD(void, write_marker_byte, (j_compress_ptr info, int val));

  if (cinfo->next_scanline != 0 ||
      (cinfo->global_state != CSTATE_SCANNING &&
       cinfo->global_state != CSTATE_RAW_OK &&
       cinfo->global_state != CSTATE_WRCOEFS))
    ERREXIT1(cinfo, JERR_BAD_STATE, cinfo->global_state);

  (*cinfo->marker->write_marker_header) (cinfo, marker, datalen);
  write_marker_byte = cinfo->marker->write_marker_byte;	/* copy for speed */
  while (datalen--) {
    (*write_marker_byte) (cinfo, *dataptr);
    dataptr++;
  }
}